

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tp_linear.hpp
# Opt level: O0

double sisl::tp_linear::dbspline_1(double *t)

{
  double *t_local;
  
  if ((*t <= -1.0) || (1.0 < *t)) {
    t_local = (double *)0x0;
  }
  else if (0.0 < *t || *t == 0.0) {
    t_local = (double *)0xbff0000000000000;
  }
  else {
    t_local = (double *)0x3ff0000000000000;
  }
  return (double)t_local;
}

Assistant:

static const double dbspline_1(const double &t){
            if(t > -1 && t <= 1) {
                if(t < 0) {
                    return 1;
                } else {
                    return -1;
                }
            }
            return 0;
        }